

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

AActor * __thiscall FBlockThingsIterator::Next(FBlockThingsIterator *this,bool centeronly)

{
  AActor *this_00;
  FBlockNode *pFVar1;
  uint uVar2;
  int iVar3;
  HashEntry *pHVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  size_t hash;
  double blocktop;
  double blockbottom;
  double blockright;
  double blockleft;
  HashEntry *pHStack_38;
  int i;
  HashEntry *entry;
  FBlockNode *mynode;
  AActor *me;
  bool centeronly_local;
  FBlockThingsIterator *this_local;
  
  while( true ) {
    while (this->block == (FBlockNode *)0x0) {
      iVar3 = this->curx + 1;
      this->curx = iVar3;
      if (this->maxx < iVar3) {
        this->curx = this->minx;
        iVar3 = this->cury + 1;
        this->cury = iVar3;
        if (this->maxy < iVar3) {
          return (AActor *)0x0;
        }
      }
      StartBlock(this,this->curx,this->cury);
    }
    this_00 = this->block->Me;
    pFVar1 = this->block;
    this->block = this->block->NextActor;
    if ((pFVar1->NextBlock == (FBlockNode *)0x0) && (pFVar1->PrevBlock == &this_00->BlockNode))
    break;
    if (centeronly) {
      dVar6 = (double)(this->curx << 7) + bmaporgx;
      dVar7 = (double)(this->cury << 7) + bmaporgy;
      dVar8 = AActor::X(this_00);
      if ((((dVar6 <= dVar8) && (dVar8 = AActor::X(this_00), dVar8 < dVar6 + 128.0)) &&
          (dVar6 = AActor::Y(this_00), dVar7 <= dVar6)) &&
         (dVar6 = AActor::Y(this_00), dVar6 < dVar7 + 128.0)) {
        return this_00;
      }
    }
    else {
      uVar5 = (ulong)this_00 >> 3 & 0x1f;
      blockleft._4_4_ = this->Buckets[uVar5];
      while ((-1 < blockleft._4_4_ &&
             (pHVar4 = GetHashEntry(this,blockleft._4_4_), pHVar4->Actor != this_00))) {
        blockleft._4_4_ = pHVar4->Next;
      }
      if (blockleft._4_4_ < 0) {
        if (this->NumFixedHash < 10) {
          pHStack_38 = this->FixedHash + this->NumFixedHash;
          pHStack_38->Next = this->Buckets[uVar5];
          iVar3 = this->NumFixedHash;
          this->NumFixedHash = iVar3 + 1;
          this->Buckets[uVar5] = iVar3;
        }
        else {
          uVar2 = TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Size
                            (&this->DynHash);
          if (uVar2 == 0) {
            TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Grow
                      (&this->DynHash,0x32);
          }
          uVar2 = TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Reserve
                            (&this->DynHash,1);
          pHStack_38 = TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::
                       operator[](&this->DynHash,(long)(int)uVar2);
          pHStack_38->Next = this->Buckets[uVar5];
          this->Buckets[uVar5] = uVar2 + 10;
        }
        pHStack_38->Actor = this_00;
        return this_00;
      }
    }
  }
  return this_00;
}

Assistant:

AActor *FBlockThingsIterator::Next(bool centeronly)
{
	for (;;)
	{
		while (block != NULL)
		{
			AActor *me = block->Me;
			FBlockNode *mynode = block;
			HashEntry *entry;
			int i;

			block = block->NextActor;
			// Don't recheck things that were already checked
			if (mynode->NextBlock == NULL && mynode->PrevBlock == &me->BlockNode)
			{ // This actor doesn't span blocks, so we know it can only ever be checked once.
				return me;
			}
			if (centeronly)
			{
				// Block boundaries for compatibility mode
				double blockleft = (curx * MAPBLOCKUNITS) + bmaporgx;
				double blockright = blockleft + MAPBLOCKUNITS;
				double blockbottom = (cury * MAPBLOCKUNITS) + bmaporgy;
				double blocktop = blockbottom + MAPBLOCKUNITS;

				// only return actors with the center in this block
				if (me->X() >= blockleft && me->X() < blockright &&
					me->Y() >= blockbottom && me->Y() < blocktop)
				{
					return me;
				}
			}
			else
			{
				size_t hash = ((size_t)me >> 3) % countof(Buckets);
				for (i = Buckets[hash]; i >= 0; )
				{
					entry = GetHashEntry(i);
					if (entry->Actor == me)
					{ // I've already been checked. Skip to the next actor.
						break;
					}
					i = entry->Next;
				}
				if (i < 0)
				{ // Add me to the hash table and return me.
					if (NumFixedHash < (int)countof(FixedHash))
					{
						entry = &FixedHash[NumFixedHash];
						entry->Next = Buckets[hash];
						Buckets[hash] = NumFixedHash++;
					}
					else
					{
						if (DynHash.Size() == 0)
						{
							DynHash.Grow(50);
						}
						i = DynHash.Reserve(1);
						entry = &DynHash[i];
						entry->Next = Buckets[hash];
						Buckets[hash] = i + countof(FixedHash);
					}
					entry->Actor = me;
					return me;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}